

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::unquantizeColorEndpoints
               (deUint32 *dst,ISEDecodedResult *iseResults,int numEndpoints,ISEParams *iseParams)

{
  int iVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  uint uVar8;
  deUint32 dVar9;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int endpointNdx_1;
  deUint32 B;
  deUint32 A;
  deUint32 f;
  deUint32 e;
  deUint32 d;
  deUint32 c;
  deUint32 b;
  deUint32 a;
  int endpointNdx;
  deUint32 C;
  int rangeCase;
  ISEParams *iseParams_local;
  int numEndpoints_local;
  ISEDecodedResult *iseResults_local;
  deUint32 *dst_local;
  
  if ((iseParams->mode == ISEMODE_TRIT) || (iseParams->mode == ISEMODE_QUINT)) {
    iVar1 = 1;
    if (iseParams->mode == ISEMODE_TRIT) {
      iVar1 = 2;
    }
    iVar1 = iseParams->numBits * 2 - iVar1;
    dVar9 = unquantizeColorEndpoints::Ca[iVar1];
    for (b = 0; (int)b < numEndpoints; b = b + 1) {
      dVar2 = getBit(iseResults[(int)b].m,0);
      dVar3 = getBit(iseResults[(int)b].m,1);
      dVar4 = getBit(iseResults[(int)b].m,2);
      dVar5 = getBit(iseResults[(int)b].m,3);
      dVar6 = getBit(iseResults[(int)b].m,4);
      dVar7 = getBit(iseResults[(int)b].m,5);
      uVar8 = 0x1ff;
      if (dVar2 == 0) {
        uVar8 = 0;
      }
      if (iVar1 == 0) {
        local_5c = 0;
      }
      else {
        if (iVar1 == 1) {
          local_60 = 0;
        }
        else {
          if (iVar1 == 2) {
            local_64 = dVar3 << 8 | dVar3 << 4 | dVar3 << 2 | dVar3 << 1;
          }
          else {
            if (iVar1 == 3) {
              local_68 = dVar3 << 8 | dVar3 << 3 | dVar3 << 2;
            }
            else {
              if (iVar1 == 4) {
                local_6c = dVar4 << 8 | dVar3 << 7 | dVar4 << 3 | dVar3 << 2 | dVar4 << 1 | dVar3;
              }
              else {
                if (iVar1 == 5) {
                  local_70 = dVar4 << 8 | dVar3 << 7 | dVar4 << 2 | dVar3 << 1 | dVar4;
                }
                else {
                  if (iVar1 == 6) {
                    local_74 = dVar5 << 8 | dVar4 << 7 | dVar3 << 6 | dVar5 << 2 | dVar4 << 1 |
                               dVar3;
                  }
                  else {
                    if (iVar1 == 7) {
                      local_78 = dVar5 << 8 | dVar4 << 7 | dVar3 << 6 | dVar5 << 1 | dVar4;
                    }
                    else {
                      if (iVar1 == 8) {
                        local_7c = dVar6 << 8 | dVar5 << 7 | dVar4 << 6 | dVar3 << 5 | dVar6 << 1 |
                                   dVar5;
                      }
                      else {
                        if (iVar1 == 9) {
                          local_80 = dVar6 << 8 | dVar5 << 7 | dVar4 << 6 | dVar3 << 5 | dVar6;
                        }
                        else {
                          if (iVar1 == 10) {
                            local_84 = dVar7 << 8 | dVar6 << 7 | dVar5 << 6 | dVar4 << 5 |
                                       dVar3 << 4 | dVar7;
                          }
                          else {
                            local_84 = 0xffffffff;
                          }
                          local_80 = local_84;
                        }
                        local_7c = local_80;
                      }
                      local_78 = local_7c;
                    }
                    local_74 = local_78;
                  }
                  local_70 = local_74;
                }
                local_6c = local_70;
              }
              local_68 = local_6c;
            }
            local_64 = local_68;
          }
          local_60 = local_64;
        }
        local_5c = local_60;
      }
      dst[(int)b] = (iseResults[(int)b].tq * dVar9 + local_5c ^ uVar8) >> 2 | uVar8 & 0x80;
    }
  }
  else {
    for (local_58 = 0; local_58 < numEndpoints; local_58 = local_58 + 1) {
      dVar9 = bitReplicationScale(iseResults[local_58].v,iseParams->numBits,8);
      dst[local_58] = dVar9;
    }
  }
  return;
}

Assistant:

void unquantizeColorEndpoints (deUint32* dst, const ISEDecodedResult* iseResults, int numEndpoints, const ISEParams& iseParams)
{
	if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
	{
		const int rangeCase				= iseParams.numBits*2 - (iseParams.mode == ISEMODE_TRIT ? 2 : 1);
		DE_ASSERT(de::inRange(rangeCase, 0, 10));
		static const deUint32	Ca[11]	= { 204, 113, 93, 54, 44, 26, 22, 13, 11, 6, 5 };
		const deUint32			C		= Ca[rangeCase];

		for (int endpointNdx = 0; endpointNdx < numEndpoints; endpointNdx++)
		{
			const deUint32 a = getBit(iseResults[endpointNdx].m, 0);
			const deUint32 b = getBit(iseResults[endpointNdx].m, 1);
			const deUint32 c = getBit(iseResults[endpointNdx].m, 2);
			const deUint32 d = getBit(iseResults[endpointNdx].m, 3);
			const deUint32 e = getBit(iseResults[endpointNdx].m, 4);
			const deUint32 f = getBit(iseResults[endpointNdx].m, 5);

			const deUint32 A = a == 0 ? 0 : (1<<9)-1;
			const deUint32 B = rangeCase == 0	? 0
							 : rangeCase == 1	? 0
							 : rangeCase == 2	? (b << 8) |									(b << 4) |				(b << 2) |	(b << 1)
							 : rangeCase == 3	? (b << 8) |												(b << 3) |	(b << 2)
							 : rangeCase == 4	? (c << 8) | (b << 7) |										(c << 3) |	(b << 2) |	(c << 1) |	(b << 0)
							 : rangeCase == 5	? (c << 8) | (b << 7) |													(c << 2) |	(b << 1) |	(c << 0)
							 : rangeCase == 6	? (d << 8) | (c << 7) | (b << 6) |										(d << 2) |	(c << 1) |	(b << 0)
							 : rangeCase == 7	? (d << 8) | (c << 7) | (b << 6) |													(d << 1) |	(c << 0)
							 : rangeCase == 8	? (e << 8) | (d << 7) | (c << 6) | (b << 5) |										(e << 1) |	(d << 0)
							 : rangeCase == 9	? (e << 8) | (d << 7) | (c << 6) | (b << 5) |													(e << 0)
							 : rangeCase == 10	? (f << 8) | (e << 7) | (d << 6) | (c << 5) |	(b << 4) |										(f << 0)
							 : (deUint32)-1;
			DE_ASSERT(B != (deUint32)-1);

			dst[endpointNdx] = (((iseResults[endpointNdx].tq*C + B) ^ A) >> 2) | (A & 0x80);
		}
	}
	else
	{
		DE_ASSERT(iseParams.mode == ISEMODE_PLAIN_BIT);

		for (int endpointNdx = 0; endpointNdx < numEndpoints; endpointNdx++)
			dst[endpointNdx] = bitReplicationScale(iseResults[endpointNdx].v, iseParams.numBits, 8);
	}
}